

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

void __thiscall SQArray::Append(SQArray *this,SQObject *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  uint uVar3;
  SQObjectPtr *p;
  uint uVar4;
  ulong uVar5;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = o->_type;
  local_28.super_SQObject._flags = o->_flags;
  local_28.super_SQObject._5_3_ = *(undefined3 *)&o->field_0x5;
  local_28.super_SQObject._unVal = (SQObjectValue)(o->_unVal).pTable;
  if ((local_28.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  uVar3 = (this->_values)._allocated;
  uVar4 = (this->_values)._size;
  p = (this->_values)._vals;
  if (uVar3 <= uVar4) {
    uVar5 = 4;
    if (uVar4 * 2 != 0) {
      uVar5 = (ulong)(uVar4 * 2);
    }
    p = (SQObjectPtr *)sq_vm_realloc((this->_values)._alloc_ctx,p,(ulong)uVar3 << 4,uVar5 << 4);
    (this->_values)._vals = p;
    (this->_values)._allocated = (size_type)uVar5;
    uVar4 = (this->_values)._size;
  }
  (this->_values)._size = uVar4 + 1;
  pSVar2 = p + uVar4;
  (pSVar2->super_SQObject)._type = local_28.super_SQObject._type;
  (pSVar2->super_SQObject)._flags = local_28.super_SQObject._flags;
  *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = local_28.super_SQObject._5_3_;
  (pSVar2->super_SQObject)._unVal.pTable = (SQTable *)local_28.super_SQObject._unVal;
  if ((p[uVar4].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((p[uVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return;
}

Assistant:

void Append(const SQObject &o){_values.push_back(o); VT_PUSHBACK(o, _ss(this)->_root_vm); }